

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  int iVar5;
  Mat *this_00;
  size_t sVar6;
  size_t sVar7;
  pointer pMVar8;
  undefined1 auVar9 [12];
  int *piVar10;
  Rect RVar11;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar12;
  undefined4 uVar13;
  int iVar14;
  undefined1 (*pauVar15) [16];
  uint uVar16;
  long lVar17;
  ulong uVar18;
  float *pfVar19;
  pointer pRVar20;
  ulong uVar21;
  void *pvVar22;
  ulong uVar23;
  undefined1 (*pauVar24) [16];
  void *pvVar25;
  void *pvVar26;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  int _c;
  void *pvVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float in_XMM5_Db;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  vector<int,_std::allocator<int>_> picked;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  vector<float,_std::allocator<float>_> scores;
  Mat proposals;
  void *ptr;
  int local_264;
  Proposal *local_260;
  undefined1 local_258 [12];
  float fStack_24c;
  int *local_248;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_238;
  vector<float,_std::allocator<float>_> local_218;
  undefined1 (*local_1f8) [16];
  undefined8 uStack_1f0;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  long *local_1d8;
  undefined8 uStack_1d0;
  uint local_1c8;
  uint uStack_1c4;
  ulong uStack_1c0;
  pointer local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  undefined1 (*local_1a0) [16];
  uint local_198;
  float local_194;
  float local_190;
  float local_18c;
  vector<float,_std::allocator<float>_> local_188;
  undefined4 uStack_170;
  long *local_168;
  undefined8 local_160;
  undefined8 uStack_158;
  long local_150;
  float local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  ulong local_130;
  void *local_128;
  void *local_120;
  undefined1 (*local_118) [16];
  void *local_110;
  void *local_108;
  void *local_100;
  ulong local_f8;
  ulong local_f0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  void *local_a8;
  void *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined1 local_48 [24];
  
  local_1b8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_f8 = (ulong)local_1b8->w;
  local_f0 = (ulong)(uint)local_1b8->h;
  uVar16 = (this->anchors).h;
  uVar29 = local_1b8->h * local_1b8->w;
  auVar35._4_4_ = -(uint)(uVar16 == 0);
  auVar35._0_4_ = -(uint)(uVar29 == 0);
  auVar35._8_8_ = 0;
  movmskps(3,auVar35 << 0x40);
  local_1f8 = (undefined1 (*) [16])0x0;
  uStack_1f0._0_4_ = 0;
  uStack_1f0._4_4_ = 0;
  uStack_1f0 = (int *)0x0;
  uStack_1e8 = 4;
  uStack_1e4 = 0;
  uStack_1e0 = 1;
  local_1d8 = (long *)0x0;
  local_1c8 = uVar29;
  uStack_1d0 = 0x400000003;
  uStack_1c4 = uVar16;
  uStack_1c0 = (long)(int)(uVar29 * 4) & 0x3ffffffffffffffc;
  lVar17 = uStack_1c0 * (long)(int)uVar16;
  local_260 = this;
  local_e8 = top_blobs;
  if (lVar17 != 0) {
    local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    iVar14 = posix_memalign((void **)&local_188,0x10,lVar17 * 4 + 4);
    if (iVar14 != 0) {
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
    }
    local_1f8 = (undefined1 (*) [16])
                local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
    uStack_1f0 = (int *)((undefined1 *)
                         local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar17 * 4);
    *(undefined4 *)
     ((undefined1 *)
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start + lVar17 * 4) = 1;
  }
  local_1b0 = (ulong)uVar16;
  local_198 = uVar16;
  local_130 = (ulong)uVar29;
  if (0 < (int)uVar16) {
    uVar21 = local_f8 & 0xffffffff;
    local_108 = local_1b8[1].data;
    lVar17 = local_1b8[1].cstep * local_1b8[1].elemsize;
    local_194 = (float)local_260->feat_stride;
    local_118 = local_1f8;
    local_e0 = (long)(local_260->anchors).w * (local_260->anchors).elemsize;
    lVar27 = (long)uStack_1d0._4_4_ * CONCAT44(uStack_1e4,uStack_1e8);
    local_d0 = CONCAT44(uStack_1e4,uStack_1e8) * uStack_1c0;
    local_100 = (local_260->anchors).data;
    local_b8 = lVar27 * local_f8;
    local_120 = (void *)(lVar17 * 3 + (long)local_108);
    local_d8 = lVar17 * 4;
    local_c0 = local_f8 * 4;
    local_128 = (void *)((long)local_108 + lVar17 * 2);
    local_110 = (void *)(lVar17 + (long)local_108);
    local_1a8 = 0;
    do {
      if (0 < (int)local_f0) {
        local_c8 = local_1a8 * local_e0;
        uVar3 = *(undefined8 *)((long)local_100 + local_c8 + 8);
        fVar37 = (float)uVar3 - (float)*(undefined8 *)((long)local_100 + local_c8);
        fVar41 = (float)((ulong)*(undefined8 *)((long)local_100 + local_c8) >> 0x20);
        fVar38 = (float)((ulong)uVar3 >> 0x20) - fVar41;
        fStack_80 = fVar37 * 0.5;
        fStack_7c = fVar38 * 0.5;
        local_190 = (float)local_260->feat_stride;
        local_1a0 = local_118;
        uVar18 = 0;
        local_78 = CONCAT44(fVar38,fVar37);
        uStack_70 = 0;
        pvVar22 = local_110;
        pvVar25 = local_120;
        pvVar26 = local_108;
        pvVar30 = local_128;
        fVar43 = fVar41;
        fVar39 = fVar41;
        fVar36 = fVar41;
        local_98 = fVar38;
        fStack_94 = fVar38;
        fStack_90 = fVar38;
        fStack_8c = fVar38;
        fStack_84 = in_XMM5_Db;
        do {
          local_b0 = uVar18;
          if (0 < (int)local_f8) {
            fVar40 = *(float *)((long)local_100 + local_c8);
            uStack_144 = 0;
            uStack_140 = 0;
            uStack_13c = 0;
            uVar18 = 0;
            pauVar15 = local_1a0;
            local_a8 = pvVar25;
            local_a0 = pvVar22;
            local_68 = fVar41;
            fStack_64 = fVar43;
            fStack_60 = fVar39;
            fStack_5c = fVar36;
            do {
              local_18c = *(float *)((long)local_a8 + uVar18 * 4);
              local_48._0_4_ = (*(float *)((long)local_a0 + uVar18 * 4) + 0.5) * fVar38;
              local_48._4_4_ = 0;
              local_48._8_4_ = (*(float *)((long)pvVar26 + uVar18 * 4) + 0.5) * fVar37;
              local_48._12_4_ = 0;
              local_148 = fVar40;
              local_58 = expf(*(float *)((long)pvVar30 + uVar18 * 4));
              fVar37 = expf(local_18c);
              fVar41 = (float)local_48._8_4_ + local_148;
              fVar43 = (float)local_48._0_4_ + local_68;
              fVar38 = local_58 * fStack_80;
              fVar37 = fVar37 * fStack_7c;
              auVar32._4_4_ = fVar37;
              auVar32._0_4_ = fVar38;
              auVar32._8_4_ = fVar41;
              auVar32._12_4_ = fVar43;
              auVar9._4_8_ = auVar32._8_8_;
              auVar9._0_4_ = fVar37 + local_68 * fStack_84;
              auVar33._0_8_ = auVar9._0_8_ << 0x20;
              auVar33._8_4_ = fVar41 + fVar38;
              auVar33._12_4_ = fVar43 + fVar37;
              *(ulong *)*pauVar15 = CONCAT44(fVar43 - fVar37,fVar41 - fVar38);
              *(long *)(*pauVar15 + 8) = auVar33._8_8_;
              fVar40 = local_148 + local_190;
              uVar18 = uVar18 + 1;
              pauVar15 = (undefined1 (*) [16])(*pauVar15 + lVar27);
              pvVar22 = local_a0;
              pvVar25 = local_a8;
              fVar37 = (float)local_78;
              in_XMM5_Db = fStack_84;
              fVar38 = local_98;
              fVar41 = local_68;
              fVar43 = fStack_64;
              fVar39 = fStack_60;
              fVar36 = fStack_5c;
            } while (uVar21 != uVar18);
          }
          fVar41 = fVar41 + local_194;
          uVar18 = local_b0 + 1;
          local_1a0 = (undefined1 (*) [16])(*local_1a0 + local_b8);
          pvVar25 = (void *)((long)pvVar25 + local_c0);
          pvVar30 = (void *)((long)pvVar30 + local_c0);
          pvVar22 = (void *)((long)pvVar22 + local_c0);
          pvVar26 = (void *)((long)pvVar26 + local_c0);
        } while (uVar18 != local_f0);
      }
      local_1a8 = local_1a8 + 1;
      local_118 = (undefined1 (*) [16])(*local_118 + local_d0);
      local_120 = (void *)((long)local_120 + local_d8);
      local_128 = (void *)((long)local_128 + local_d8);
      local_110 = (void *)((long)local_110 + local_d8);
      local_108 = (void *)((long)local_108 + local_d8);
    } while (local_1a8 != local_1b0);
  }
  uVar21 = local_130 & 0xffffffff;
  if (0 < (int)local_198) {
    fVar37 = (float)*local_1b8[2].data;
    fVar38 = (float)((ulong)*local_1b8[2].data >> 0x20);
    auVar34._0_4_ = fVar38 + -1.0;
    auVar34._4_4_ = fVar37 + -1.0;
    auVar34._8_4_ = fVar38 + -1.0;
    auVar34._12_4_ = fVar37 + -1.0;
    uVar18 = 0;
    pauVar15 = local_1f8;
    do {
      uVar23 = uVar21;
      pauVar24 = pauVar15;
      if (0 < (int)local_130) {
        do {
          auVar35 = minps(*pauVar24,auVar34);
          auVar35 = maxps(auVar35,ZEXT816(0));
          *pauVar24 = auVar35;
          pauVar24 = (undefined1 (*) [16])
                     (*pauVar24 + (long)uStack_1d0._4_4_ * CONCAT44(uStack_1e4,uStack_1e8));
          uVar23 = uVar23 - 1;
        } while (uVar23 != 0);
      }
      uVar18 = uVar18 + 1;
      pauVar15 = (undefined1 (*) [16])(*pauVar15 + CONCAT44(uStack_1e4,uStack_1e8) * uStack_1c0);
    } while (uVar18 != local_1b0);
  }
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Rect *)0x0;
  local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (0 < (int)local_198) {
    local_148 = (float)local_260->min_size * *(float *)((long)local_1b8[2].data + 8);
    uVar23 = 0;
    uVar18 = local_1b0;
    do {
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)(*local_1f8 + uStack_1c0 * uVar23 * CONCAT44(uStack_1e4,uStack_1e8));
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = uStack_1e8;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = uStack_1e4;
      uStack_170 = uStack_1e0;
      local_168 = local_1d8;
      local_160._0_4_ = 2;
      uVar13 = (undefined4)local_160;
      local_160._0_4_ = 2;
      local_160._4_4_ = uStack_1d0._4_4_;
      uStack_158 = CONCAT44(1,local_1c8);
      local_150 = (long)(int)(local_1c8 * uStack_1d0._4_4_);
      if (0 < (int)local_130) {
        pfVar19 = (float *)(local_1b8->elemsize * local_1b8->cstep * uVar18 + (long)local_1b8->data)
        ;
        uVar28 = 0;
        do {
          lVar17 = (long)(int)uVar28 * (long)local_160._4_4_ *
                   CONCAT44(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_,
                            local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._0_4_);
          if ((local_148 <=
               (*(float *)((long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar17 + 8) + 1.0) -
               *(float *)((long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar17)) &&
             (local_148 <=
              (*(float *)((long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start + lVar17 + 0xc) + 1.0) -
              *(float *)((long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start + lVar17 + 4))) {
            local_258._4_4_ =
                 *(float *)((long)local_188.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar17 + 4);
            local_258._0_4_ =
                 *(pointer)((long)local_188.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar17);
            local_258._8_4_ =
                 *(undefined4 *)
                  ((long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar17 + 8);
            fStack_24c = *(float *)((long)local_188.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar17 + 0xc);
            RVar11 = _local_258;
            if (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<ncnn::Rect,std::allocator<ncnn::Rect>>::
              _M_realloc_insert<ncnn::Rect_const&>
                        ((vector<ncnn::Rect,std::allocator<ncnn::Rect>> *)&local_238,
                         (iterator)
                         local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Rect *)local_258);
            }
            else {
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x1 =
                   *(pointer)((long)local_188.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar17);
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y1 = (float)local_258._4_4_;
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x2 = (float)local_258._8_4_;
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y2 = fStack_24c;
              local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
              _local_258 = RVar11;
            }
            if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_218,
                         (iterator)
                         local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,pfVar19);
            }
            else {
              *local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = *pfVar19;
              local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar28 = uVar28 + 1;
          pfVar19 = pfVar19 + 1;
          uVar13 = (undefined4)local_160;
        } while (uVar21 != uVar28);
      }
      local_160._0_4_ = uVar13;
      piVar10 = (int *)CONCAT44(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_168 == (long *)0x0) {
            if (local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              free(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
            }
          }
          else {
            (**(code **)(*local_168 + 0x18))();
          }
        }
      }
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ = 0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ = 0;
      uStack_170 = 0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      local_160 = 0;
      uStack_158 = 0;
      local_150 = 0;
      uVar23 = uVar23 + 1;
      uVar18 = uVar18 + 1;
    } while (uVar23 != local_1b0);
  }
  if (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      qsort_descent_inplace<ncnn::Rect>
                (&local_238,&local_218,0,
                 (int)((ulong)((long)local_218.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_218.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar14 = local_260->pre_nms_topN;
  if (0 < (long)iVar14) {
    if (iVar14 < (int)((ulong)((long)local_238.
                                     super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_238.
                                    super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 4)) {
      std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&local_238,(long)iVar14);
      std::vector<float,_std::allocator<float>_>::resize(&local_218,(long)local_260->pre_nms_topN);
    }
  }
  local_248 = (int *)0x0;
  local_258._0_4_ = 0.0;
  local_258._4_4_ = 0.0;
  local_258._8_4_ = 0.0;
  fStack_24c = 0.0;
  local_148 = local_260->nms_thresh;
  uVar16 = (uint)((ulong)((long)local_238.
                                super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_188,(long)(int)uVar16,(allocator_type *)&local_264);
  if ((int)uVar16 < 1) {
    local_264 = 0;
  }
  else {
    pfVar19 = &(local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_start)->x2;
    uVar21 = 0;
    do {
      uVar2 = ((Rect *)(pfVar19 + -2))->x1;
      uVar4 = ((Rect *)(pfVar19 + -2))->y1;
      *(float *)((undefined1 *)
                 local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar21 * 4) =
           ((float)((ulong)*(undefined8 *)pfVar19 >> 0x20) - (float)uVar4) *
           ((float)*(undefined8 *)pfVar19 - (float)uVar2);
      uVar21 = uVar21 + 1;
      pfVar19 = pfVar19 + 4;
    } while ((uVar16 & 0x7fffffff) != uVar21);
    local_264 = 0;
    if (0 < (int)uVar16) {
      do {
        uVar29 = (uint)((ulong)((long)stack0xfffffffffffffdb0 - local_258._0_8_) >> 2);
        if ((int)uVar29 < 1) {
LAB_00131e76:
          if (stack0xfffffffffffffdb0 == local_248) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)local_258,stack0xfffffffffffffdb0,
                       &local_264);
          }
          else {
            *stack0xfffffffffffffdb0 = local_264;
            stack0xfffffffffffffdb0 = stack0xfffffffffffffdb0 + 1;
          }
        }
        else {
          lVar17 = (long)local_264;
          fVar37 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17].x1;
          bVar31 = true;
          uVar21 = 0;
          do {
            lVar27 = (long)*(int *)(local_258._0_8_ + uVar21 * 4);
            fVar38 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar27].x2;
            fVar41 = 0.0;
            if (fVar37 <= fVar38) {
              pRVar20 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar27;
              fVar43 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar17].x2;
              fVar39 = pRVar20->x1;
              if (fVar39 <= fVar43) {
                fVar36 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_start[lVar17].y1;
                fVar40 = pRVar20->y2;
                if (fVar36 <= fVar40) {
                  fVar1 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start[lVar17].y2;
                  fVar42 = pRVar20->y1;
                  if (fVar42 <= fVar1) {
                    if (fVar43 <= fVar38) {
                      fVar38 = fVar43;
                    }
                    if (fVar39 <= fVar37) {
                      fVar39 = fVar37;
                    }
                    if (fVar1 <= fVar40) {
                      fVar40 = fVar1;
                    }
                    if (fVar42 <= fVar36) {
                      fVar42 = fVar36;
                    }
                    fVar41 = (fVar40 - fVar42) * (fVar38 - fVar39);
                  }
                }
              }
            }
            if (local_148 <
                fVar41 / ((*(float *)((undefined1 *)
                                      local_188.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start + lVar17 * 4) -
                          fVar41) +
                         *(float *)((undefined1 *)
                                    local_188.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar27 * 4))) {
              bVar31 = false;
            }
            uVar21 = uVar21 + 1;
          } while ((uVar29 & 0x7fffffff) != uVar21);
          if (bVar31) goto LAB_00131e76;
        }
        local_264 = local_264 + 1;
      } while (local_264 < (int)uVar16);
    }
  }
  if ((undefined1 (*) [16])
      local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (undefined1 (*) [16])0x0) {
    operator_delete(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_188.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pvVar12 = local_e8;
  uVar21 = (ulong)((long)stack0xfffffffffffffdb0 - local_258._0_8_) >> 2;
  uVar18 = uVar21 & 0xffffffff;
  if (local_260->after_nms_topN < (int)uVar21) {
    uVar18 = (ulong)(uint)local_260->after_nms_topN;
  }
  this_00 = (local_e8->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _c = (int)uVar18;
  Mat::create(this_00,4,1,_c,4,(Allocator *)0x0);
  iVar14 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if (0 < _c) {
      sVar6 = this_00->cstep;
      sVar7 = this_00->elemsize;
      pfVar19 = (float *)((long)this_00->data + 0xc);
      uVar21 = 0;
      do {
        iVar5 = *(int *)(local_258._0_8_ + uVar21 * 4);
        pfVar19[-3] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar5].x1;
        pfVar19[-2] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar5].y1;
        pfVar19[-1] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar5].x2;
        *pfVar19 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar5].y2;
        uVar21 = uVar21 + 1;
        pfVar19 = (float *)((long)pfVar19 + sVar6 * sVar7);
      } while (uVar18 != uVar21);
    }
    pMVar8 = (pvVar12->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (0x40 < (ulong)((long)(pvVar12->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pMVar8)) {
      Mat::create(pMVar8 + 1,1,1,_c,4,(Allocator *)0x0);
      if (pMVar8[1].data == (void *)0x0) {
        bVar31 = true;
      }
      else {
        bVar31 = (long)pMVar8[1].c * pMVar8[1].cstep == 0;
      }
      if (bVar31) goto LAB_0013202e;
      if (0 < _c) {
        pfVar19 = (float *)pMVar8[1].data;
        sVar6 = pMVar8[1].cstep;
        sVar7 = pMVar8[1].elemsize;
        uVar21 = 0;
        do {
          *pfVar19 = local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[*(int *)(local_258._0_8_ + uVar21 * 4)];
          uVar21 = uVar21 + 1;
          pfVar19 = (float *)((long)pfVar19 + sVar6 * sVar7);
        } while (uVar18 != uVar21);
      }
    }
    iVar14 = 0;
  }
LAB_0013202e:
  if ((void *)local_258._0_8_ != (void *)0x0) {
    operator_delete((void *)local_258._0_8_,(long)local_248 - local_258._0_8_);
  }
  if (local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (uStack_1f0 != (int *)0x0) {
    LOCK();
    *uStack_1f0 = *uStack_1f0 + -1;
    UNLOCK();
    if (*uStack_1f0 == 0) {
      if (local_1d8 == (long *)0x0) {
        if (local_1f8 != (undefined1 (*) [16])0x0) {
          free(local_1f8);
        }
      }
      else {
        (**(code **)(*local_1d8 + 0x18))();
      }
    }
  }
  return iVar14;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * exp(dw);
                float pb_h = anchor_h * exp(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<int> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}